

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O0

void __thiscall mini_bus::NotifyToken<int>::notify(NotifyToken<int> *this,int *rhs)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  int *rhs_local;
  NotifyToken<int> *this_local;
  
  lock._M_device = (mutex_type *)rhs;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mtx);
  std::optional<int>::emplace<int>(&this->value,(int *)lock._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  std::condition_variable::notify_one();
  return;
}

Assistant:

inline void notify(T &&rhs) override {
    {
      std::lock_guard lock{mtx};
      value.emplace(std::move(rhs));
    }
    cv.notify_one();
  }